

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

Position aiBegin(char (*board) [15],int me)

{
  Position PVar1;
  Position PVar2;
  long lVar3;
  
  PVar2.x = 0;
  PVar2.y = 0;
  do {
    lVar3 = -0xf;
    PVar1 = PVar2;
    do {
      if (board[1][lVar3] == '\0') {
        return PVar1;
      }
      PVar1 = (Position)((long)PVar1 + 0x100000000);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    PVar2 = (Position)((long)PVar2 + 1);
    board = board + 1;
  } while (PVar2 != (Position)0xf);
  PVar1.x = 0;
  PVar1.y = 0;
  return PVar1;
}

Assistant:

struct Position aiBegin(const char board[BOARD_SIZE][BOARD_SIZE], int me) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。 
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。 
     */
    int i, j;
    struct Position preferedPos = {0, 0};

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                preferedPos.x = i;
                preferedPos.y = j;
                return preferedPos;
            }
        }
    }

    return preferedPos;
}